

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Combine<duckdb::ArgMinMaxState<duckdb::hugeint_t,duckdb::hugeint_t>,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
               (ArgMinMaxState<duckdb::hugeint_t,_duckdb::hugeint_t> *source,
               ArgMinMaxState<duckdb::hugeint_t,_duckdb::hugeint_t> *target,
               AggregateInputData *param_3)

{
  bool bVar1;
  hugeint_t *in_RDX;
  hugeint_t *in_RSI;
  byte *in_RDI;
  hugeint_t *in_stack_00000018;
  ArgMinMaxState<duckdb::hugeint_t,_duckdb::hugeint_t> *in_stack_00000020;
  
  if (((*in_RDI & 1) != 0) &&
     (((in_RSI->lower & 1) == 0 ||
      (bVar1 = LessThan::Operation<duckdb::hugeint_t>(in_RSI,in_RDX), bVar1)))) {
    Assign<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::ArgMinMaxState<duckdb::hugeint_t,duckdb::hugeint_t>>
              (in_stack_00000020,in_stack_00000018,(hugeint_t *)source,target._7_1_);
    *(undefined1 *)&in_RSI->lower = 1;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			Assign(target, source.arg, source.value, source.arg_null);
			target.is_initialized = true;
		}
	}